

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_while(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *this,typed_expression_t *cond,typed_statement_t *stmt)

{
  vector<long,std::allocator<long>> *pvVar1;
  iterator iVar2;
  vector<long,_std::allocator<long>_> *pvVar3;
  size_type sVar4;
  size_type sVar5;
  pointer plVar6;
  vector<long,_std::allocator<long>_> stmt_bytecode;
  vector<long,_std::allocator<long>_> cond_bytecode;
  long local_a0;
  vector<long,_std::allocator<long>_> local_98;
  vector<long,_std::allocator<long>_> local_80;
  vector<long,_std::allocator<long>_> local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar4 = compile_tmp_rvalue_expression(cond,&local_48);
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar5 = compile_tmp_statement(stmt,&local_68);
  std::vector<long,_std::allocator<long>_>::vector(&local_80,&local_48);
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar6 = local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a0 = *plVar6;
      pvVar1 = (vector<long,std::allocator<long>> *)(this->_bytecode_back_inserter).container;
      iVar2._M_current = *(long **)(pvVar1 + 8);
      if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (pvVar1,iVar2,&local_a0);
      }
      else {
        *iVar2._M_current = local_a0;
        *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_a0 = 4;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_a0);
  }
  else {
    *iVar2._M_current = 4;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_a0 = sVar5 + 2;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_a0);
  }
  else {
    *iVar2._M_current = local_a0;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  std::vector<long,_std::allocator<long>_>::vector(&local_98,&local_68);
  if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar6 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a0 = *plVar6;
      pvVar1 = (vector<long,std::allocator<long>> *)(this->_bytecode_back_inserter).container;
      iVar2._M_current = *(long **)(pvVar1 + 8);
      if (iVar2._M_current == *(long **)(pvVar1 + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (pvVar1,iVar2,&local_a0);
      }
      else {
        *iVar2._M_current = local_a0;
        *(long **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_a0 = 3;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_a0);
  }
  else {
    *iVar2._M_current = 3;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_a0 = -4 - (sVar4 + sVar5);
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_a0);
  }
  else {
    *iVar2._M_current = local_a0;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compile_while(tchecker::typed_expression_t const & cond, tchecker::typed_statement_t const & stmt)
  {
    // pre-compute cond and stmt bytecodes to get their respective lengths

    std::vector<tchecker::bytecode_t> cond_bytecode;
    auto cond_len = compile_tmp_rvalue_expression(cond, cond_bytecode);

    std::vector<tchecker::bytecode_t> stmt_bytecode;
    auto stmt_len = compile_tmp_statement(stmt, stmt_bytecode);

    // generation of while bytecode
    //  - insert 'cond' bytecode
    append_bytecode(_bytecode_back_inserter, cond_bytecode);

    //  - insert a conditional jump over 'stmt' bytecode and loop instruction
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = stmt_len + 2;

    //  - insert bytecode for the 'stmt' statement
    append_bytecode(_bytecode_back_inserter, stmt_bytecode);

    //  - insert a loop back to 'cond' bytecode
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = -(cond_len + 2 + stmt_len + 2);
  }